

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O1

_Bool xdr_reply_decode(XDR *xdrs,rpc_msg *dmsg,int32_t *buf)

{
  reply_body *prVar1;
  anon_union_432_2_d8689e7e_for_ru *paVar2;
  opaque_auth *poVar3;
  u_int *puVar4;
  uint32_t *puVar5;
  uint uVar6;
  reply_stat rVar7;
  _Bool _Var8;
  uint *puVar9;
  uint *puVar10;
  undefined8 uVar11;
  uint *puVar12;
  char *pcVar13;
  char *pcVar14;
  char local_34 [4];
  
  if (buf == (int32_t *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_reply_decode",0x126);
    }
    prVar1 = &(dmsg->ru).RM_rmb;
    puVar9 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar9) {
      _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,&prVar1->rp_stat);
      if (!_Var8) {
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar14 = "%s:%u ERROR rm_reply.rp_stat";
        _Var8 = false;
        uVar11 = 0x12a;
        goto LAB_00113229;
      }
    }
    else {
      uVar6 = *(uint *)xdrs->x_data;
      prVar1->rp_stat =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      xdrs->x_data = (uint8_t *)puVar9;
    }
    puVar9 = (uint *)0x0;
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags >> 0x19 & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_reply_decode",0x121);
    }
    uVar6 = *buf;
    puVar9 = (uint *)(buf + 1);
    (dmsg->ru).RM_rmb.rp_stat =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  }
  rVar7 = (dmsg->ru).RM_rmb.rp_stat;
  if (rVar7 == MSG_DENIED) {
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u MSG_DENIED not verified","xdr_reply_decode",0x16e);
    }
    paVar2 = &(dmsg->ru).RM_rmb.ru;
    if (puVar9 == (uint *)0x0) {
      puVar9 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar9) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)paVar2);
        if (!_Var8) {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar14 = "%s:%u ERROR rj_stat";
          _Var8 = false;
          uVar11 = 0x175;
          goto LAB_00113229;
        }
      }
      else {
        uVar6 = *(uint *)xdrs->x_data;
        (paVar2->RP_ar).ar_stat =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        xdrs->x_data = (uint8_t *)puVar9;
      }
      puVar9 = (uint *)0x0;
    }
    else {
      uVar6 = *puVar9;
      puVar9 = puVar9 + 1;
      (paVar2->RP_ar).ar_stat =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    }
    if ((paVar2->RP_ar).ar_stat == PROG_UNAVAIL) {
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED AUTH","xdr_reply_decode",0x191);
      }
      if (puVar9 != (uint *)0x0) {
        uVar6 = *puVar9;
        *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        return true;
      }
      puVar12 = (uint *)((long)&(dmsg->ru).RM_rmb.ru + 4);
      puVar10 = (uint *)xdrs->x_data;
      puVar9 = puVar10 + 1;
      if ((xdrs->x_v).vio_tail < puVar9) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,puVar12);
        if (_Var8) {
          return true;
        }
        if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar14 = "%s:%u ERROR rj_why";
        _Var8 = false;
        uVar11 = 0x198;
        goto LAB_00113229;
      }
      goto LAB_001133d5;
    }
    if ((paVar2->RP_ar).ar_stat != SUCCESS) {
      return true;
    }
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED MISMATCH","xdr_reply_decode",0x17d);
    }
    if (puVar9 == (uint *)0x0) {
      puVar5 = (uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4);
      puVar9 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar9) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,puVar5);
        if (!_Var8) {
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar14 = "%s:%u ERROR rj_vers.low";
          _Var8 = false;
          uVar11 = 0x183;
          goto LAB_00113229;
        }
      }
      else {
        uVar6 = *(uint *)xdrs->x_data;
        *puVar5 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        xdrs->x_data = (uint8_t *)puVar9;
      }
    }
    else {
      uVar6 = *puVar9;
      *(uint *)((long)&(dmsg->ru).RM_rmb.ru + 4) =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    }
    puVar12 = (uint *)((long)&(dmsg->ru).RM_rmb.ru + 8);
    puVar10 = (uint *)xdrs->x_data;
    puVar9 = puVar10 + 1;
    if (puVar9 <= (xdrs->x_v).vio_tail) goto LAB_001133d5;
    _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,puVar12);
    if (_Var8) {
      return true;
    }
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    pcVar14 = "%s:%u ERROR rj_vers.high";
    _Var8 = false;
    uVar11 = 0x189;
    goto LAB_00113229;
  }
  if (rVar7 != MSG_ACCEPTED) {
    if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR dmsg->rm_reply.rp_stat %u","xdr_reply_decode",0x1a2);
    return false;
  }
  if (puVar9 == (uint *)0x0) {
    poVar3 = &(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf;
    puVar9 = (uint *)((long)xdrs->x_data + 4);
    if (puVar9 <= (xdrs->x_v).vio_tail) {
      uVar6 = *(uint *)xdrs->x_data;
      poVar3->oa_flavor =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      xdrs->x_data = (uint8_t *)puVar9;
LAB_001130ff:
      puVar4 = &(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
      puVar9 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar9) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,puVar4);
        if (!_Var8) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            pcVar13 = "%s:%u ERROR oa_length";
            pcVar14 = "xdr_opaque_auth_decode";
            uVar11 = 0x8c;
            goto LAB_00113200;
          }
          goto LAB_00113206;
        }
      }
      else {
        uVar6 = *(uint *)xdrs->x_data;
        *puVar4 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        xdrs->x_data = (uint8_t *)puVar9;
      }
      goto LAB_00112ec5;
    }
    _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)poVar3);
    if (_Var8) goto LAB_001130ff;
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar13 = "%s:%u ERROR oa_flavor";
      pcVar14 = "xdr_opaque_auth_decode";
      uVar11 = 0x87;
LAB_00113200:
      (*__ntirpc_pkg_params.warnx_)(pcVar13,pcVar14,uVar11);
    }
  }
  else {
    uVar6 = *puVar9;
    (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_flavor =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar6 = puVar9[1];
    (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
LAB_00112ec5:
    uVar6 = (dmsg->ru).RM_rmb.ru.RP_ar.ar_verf.oa_length;
    if (uVar6 == 0) goto LAB_0011306a;
    if (uVar6 < 0x191) {
      _Var8 = (*xdrs->x_ops->x_getbytes)(xdrs,(char *)((long)&(dmsg->ru).RM_rmb.ru + 0x20),uVar6);
      if (_Var8) {
        if (((uVar6 & 3) != 0) &&
           (_Var8 = (*xdrs->x_ops->x_getbytes)(xdrs,local_34,4 - (uVar6 & 3)), !_Var8)) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR crud","xdr_opaque_decode",0x1c9);
          }
          if (!_Var8) goto LAB_00113206;
        }
LAB_0011306a:
        paVar2 = &(dmsg->ru).RM_rmb.ru;
        puVar9 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_tail < puVar9) {
          _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)paVar2);
          if (!_Var8) {
            if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar14 = "%s:%u ERROR ar_stat";
            _Var8 = false;
            uVar11 = 0x13f;
            goto LAB_00113229;
          }
        }
        else {
          uVar6 = *(uint *)xdrs->x_data;
          (paVar2->RP_ar).ar_stat =
               uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
          xdrs->x_data = (uint8_t *)puVar9;
        }
        _Var8 = true;
        if ((paVar2->RP_ar).ar_stat == PROG_MISMATCH) {
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u MISMATCH","xdr_reply_decode",0x14d);
          }
          puVar5 = (uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8);
          puVar9 = (uint *)((long)xdrs->x_data + 4);
          if ((xdrs->x_v).vio_tail < puVar9) {
            _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,puVar5);
            if (!_Var8) {
              if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
                return false;
              }
              pcVar14 = "%s:%u ERROR ar_vers.low";
              _Var8 = false;
              uVar11 = 0x151;
              goto LAB_00113229;
            }
          }
          else {
            uVar6 = *(uint *)xdrs->x_data;
            *puVar5 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                      uVar6 << 0x18;
            xdrs->x_data = (uint8_t *)puVar9;
          }
          puVar12 = (uint *)((long)&(dmsg->ru).RM_rmb.ru + 0xc);
          puVar10 = (uint *)xdrs->x_data;
          puVar9 = puVar10 + 1;
          if (puVar9 <= (xdrs->x_v).vio_tail) {
LAB_001133d5:
            uVar6 = *puVar10;
            *puVar12 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                       uVar6 << 0x18;
            xdrs->x_data = (uint8_t *)puVar9;
            return true;
          }
          _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,puVar12);
          if (_Var8) {
            return true;
          }
          if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar14 = "%s:%u ERROR ar_vers.high";
          _Var8 = false;
          uVar11 = 0x157;
        }
        else {
          if ((paVar2->RP_ar).ar_stat != SUCCESS) {
            return true;
          }
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) == 0) {
            return true;
          }
          pcVar14 = "%s:%u SUCCESS";
          uVar11 = 0x147;
        }
        goto LAB_00113229;
      }
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        pcVar13 = "%s:%u ERROR opaque";
        pcVar14 = "xdr_opaque_decode";
        uVar11 = 0x1b9;
        goto LAB_00113200;
      }
    }
    else if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_decode_it",0x70,(ulong)uVar6,400
                );
    }
  }
LAB_00113206:
  if ((__ntirpc_pkg_params.debug_flags & 1) == 0) {
    return false;
  }
  pcVar14 = "%s:%u ERROR (return)";
  _Var8 = false;
  uVar11 = 0x138;
LAB_00113229:
  (*__ntirpc_pkg_params.warnx_)(pcVar14,"xdr_reply_decode",uVar11);
  return _Var8;
}

Assistant:

bool
xdr_reply_decode(XDR *xdrs, struct rpc_msg *dmsg, int32_t *buf)
{
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		dmsg->rm_reply.rp_stat = IXDR_GET_ENUM(buf, enum_t);
	} else {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_getenum(xdrs, (enum_t *)&(dmsg->rm_reply.rp_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_reply.rp_stat",
				__func__, __LINE__);
			return (false);
		}
	}

	switch (dmsg->rm_reply.rp_stat) {
	case MSG_ACCEPTED:
	{
		struct accepted_reply *ar = (struct accepted_reply *)
						&(dmsg->rm_reply.ru);

		if (!xdr_opaque_auth_decode(xdrs, &ar->ar_verf, buf)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}

		if (!xdr_getenum(xdrs, (enum_t *)&(ar->ar_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR ar_stat",
				__func__, __LINE__);
			return (false);
		}

		switch (ar->ar_stat) {
		case SUCCESS:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u SUCCESS",
				__func__, __LINE__);
			return (true);

		case PROG_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u MISMATCH",
				__func__, __LINE__);
			if (!xdr_getuint32(xdrs, &(ar->ar_vers.low))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR ar_vers.low",
					__func__, __LINE__);
				return (false);
			}
			if (!xdr_getuint32(xdrs, &(ar->ar_vers.high))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR ar_vers.high",
					__func__, __LINE__);
				return (false);
			}

		case GARBAGE_ARGS:
		case SYSTEM_ERR:
		case PROC_UNAVAIL:
		case PROG_UNAVAIL:
			/* true */
			break;
		default:
			break;
		};	/* ar_stat */
		return (true);
	}	/* MSG_ACCEPTED */
	case MSG_DENIED:
	{
		/* XXX branch not verified */
		struct rejected_reply *rr = (struct rejected_reply *)
						&(dmsg->rm_reply.ru);

		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u MSG_DENIED not verified",
			__func__, __LINE__);

		if (buf != NULL) {
			rr->rj_stat = IXDR_GET_ENUM(buf, enum_t);
		} else if (!xdr_getenum(xdrs, (enum_t *)&(rr->rj_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rj_stat",
				__func__, __LINE__);
			return (false);
		}

		switch (rr->rj_stat) {
		case RPC_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED MISMATCH",
				__func__, __LINE__);
			if (buf != NULL) {
				rr->rj_vers.low = IXDR_GET_U_INT32(buf);
			} else if (!xdr_getuint32(xdrs, &(rr->rj_vers.low))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.low",
					__func__, __LINE__);
				return (false);
			}
			if (!xdr_getuint32(xdrs, &(rr->rj_vers.high))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.high",
					__func__, __LINE__);
				return (false);
			}
			break;

		case AUTH_ERROR:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED AUTH",
				__func__, __LINE__);
			if (buf != NULL) {
				rr->rj_why = IXDR_GET_ENUM(buf, enum_t);
			} else if (!xdr_getenum(xdrs,
					(enum_t *)&(rr->rj_why))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_why",
					__func__, __LINE__);
				return (false);
			}
			break;
		};
		return (true);
	}	/* MSG_DENIED */
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_reply.rp_stat %u",
			__func__, __LINE__,
			dmsg->rm_reply.rp_stat);
		break;
	};	/* rm_reply.rp_stat */

	return (false);
}